

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_generate.cc
# Opt level: O2

void __thiscall Trie::build_max(Trie *this,string *prefix)

{
  pointer ppTVar1;
  Trie *this_00;
  ulong uVar2;
  char __rhs;
  ulong uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this->max_count = this->terminus;
  std::__cxx11::string::_M_assign((string *)&this->max_string);
  for (uVar3 = 0;
      ppTVar1 = (this->children).super__Vector_base<Trie_*,_std::allocator<Trie_*>_>._M_impl.
                super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(this->children).super__Vector_base<Trie_*,_std::allocator<Trie_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)ppTVar1 >> 3);
      uVar3 = uVar3 + 1) {
    this_00 = ppTVar1[uVar3];
    if (this_00 != (Trie *)0x0) {
      __rhs = action2char((int)uVar3 + 1);
      std::operator+(&local_50,prefix,__rhs);
      build_max(this_00,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      uVar2 = (this->children).super__Vector_base<Trie_*,_std::allocator<Trie_*>_>._M_impl.
              super__Vector_impl_data._M_start[uVar3]->max_count;
      if (this->max_count < uVar2) {
        this->max_count = uVar2;
        std::__cxx11::string::_M_assign((string *)&this->max_string);
      }
    }
  }
  return;
}

Assistant:

void build_max(string prefix="")
  { max_count = terminus;
    max_string = prefix;
    for (size_t id=0; id<children.size(); id++)
      if (children[id])
      { char c = action2char(id + 1);
        children[id]->build_max(prefix + c);
        if (children[id]->max_count > max_count)
        { max_count  = children[id]->max_count;
          max_string = children[id]->max_string;
        }
      }
  }